

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O2

bool __thiscall nuraft::inmem_log_store::compact(inmem_log_store *this,ulong last_log_index)

{
  iterator __position;
  ulong local_38;
  
  std::mutex::lock(&this->logs_lock_);
  for (local_38 = (this->start_idx_).super___atomic_base<unsigned_long>._M_i;
      local_38 <= last_log_index; local_38 = local_38 + 1) {
    __position = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
                 ::find(&(this->logs_)._M_t,&local_38);
    if ((_Rb_tree_header *)__position._M_node != &(this->logs_)._M_t._M_impl.super__Rb_tree_header)
    {
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>>>
                          *)&this->logs_,__position);
    }
  }
  if ((this->start_idx_).super___atomic_base<unsigned_long>._M_i <= last_log_index) {
    LOCK();
    (this->start_idx_).super___atomic_base<unsigned_long>._M_i = last_log_index + 1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
  return true;
}

Assistant:

bool inmem_log_store::compact(ulong last_log_index) {
    std::lock_guard<std::mutex> l(logs_lock_);
    for (ulong ii = start_idx_; ii <= last_log_index; ++ii) {
        auto entry = logs_.find(ii);
        if (entry != logs_.end()) {
            logs_.erase(entry);
        }
    }

    // WARNING:
    //   Even though nothing has been erased,
    //   we should set `start_idx_` to new index.
    if (start_idx_ <= last_log_index) {
        start_idx_ = last_log_index + 1;
    }
    return true;
}